

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O2

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
md::ROM::get_words(vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
                  ROM *this,uint32_t begin,uint32_t end)

{
  pointer puVar1;
  uint32_t addr;
  unsigned_short local_2a;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (__return_storage_ptr__,(ulong)((end - begin >> 1) + 1));
  for (; begin < end; begin = begin + 2) {
    puVar1 = (this->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_2a = CONCAT11(puVar1[begin],puVar1[begin + 1]);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
              (__return_storage_ptr__,&local_2a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint16_t> ROM::get_words(uint32_t begin, uint32_t end) const
{
    std::vector<uint16_t> output;
    output.reserve(((end - begin) / 0x2) + 1);

    for (uint32_t addr = begin; addr < end; addr += 0x2)
        output.emplace_back(this->get_word(addr));

    return output;
}